

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::array::writer<std::wostream>
          (array *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  pointer psVar1;
  element_type *peVar2;
  long *plVar3;
  int iVar4;
  wostream *os_00;
  undefined4 extraout_var;
  value_ptr *value_2;
  pointer psVar5;
  char *pcVar6;
  value_ptr *value;
  int local_3c;
  undefined4 local_38;
  wchar_t local_34;
  
  psVar5 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar1 == psVar5) {
      std::operator<<(os,"[");
      psVar5 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar5 != psVar1) {
        pcVar6 = " ";
        do {
          std::operator<<(os,pcVar6);
          peVar2 = (psVar5->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_38 = 0;
          (*peVar2->_vptr_value[0x16])(peVar2,os,&local_38);
          psVar5 = psVar5 + 1;
          pcVar6 = ", ";
        } while (psVar5 != psVar1);
      }
      std::operator<<(os," ]");
      return os;
    }
    iVar4 = (*((psVar5->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->_vptr_value[0x12])();
    if ((char)iVar4 == '\0') break;
    psVar5 = psVar5 + 1;
  }
  plVar3 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
  if (plVar3 != (long *)0x0) {
    local_34 = (**(code **)(*plVar3 + 0x50))(plVar3,10);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,&local_34,1);
    psVar5 = (this->values_).
             super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->values_).
             super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar5 == psVar1) {
      return os;
    }
    pcVar6 = "";
    do {
      os_00 = std::operator<<(os,pcVar6);
      dump::operator<<(os_00,ind);
      std::operator<<(os_00,"- ");
      peVar2 = (psVar5->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar4 = (*peVar2->_vptr_value[2])(peVar2);
      local_3c = ind->count_ + 2 + (uint)(CONCAT44(extraout_var,iVar4) == 0) * 2;
      (*peVar2->_vptr_value[0x16])(peVar2,os,&local_3c);
      psVar5 = psVar5 + 1;
      pcVar6 = "\n";
    } while (psVar5 != psVar1);
    return os;
  }
  std::__throw_bad_cast();
}

Assistant:

OStream & array::writer (OStream & os, indent const & ind) const {
            char const * sep = "";

            bool const is_compact = values_.size () == 0 || this->is_number_array ();
            if (is_compact) {
                os << "[";
                sep = " ";
                for (value_ptr const & value : values_) {
                    os << sep;
                    value->write_impl (os, indent ());
                    sep = ", ";
                }
                os << " ]";
            } else {
                os << '\n';
                for (value_ptr const & value : values_) {
                    os << sep << ind << "- ";
                    value->write_impl (os,
                                       ind.next (value->dynamic_cast_object () == nullptr ? 4 : 2));
                    sep = "\n";
                }
            }
            return os;
        }